

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O3

void __thiscall FStat::~FStat(FStat *this)

{
  FStat **ppFVar1;
  FStat *pFVar2;
  bool bVar3;
  
  this->_vptr_FStat = (_func_int **)&PTR__FStat_00873290;
  bVar3 = FirstStat == this;
  pFVar2 = FirstStat;
  if (FirstStat == (FStat *)0x0 || bVar3) {
    ppFVar1 = &FirstStat;
  }
  else {
    do {
      ppFVar1 = &pFVar2->m_Next;
      pFVar2 = (*ppFVar1)->m_Next;
      bVar3 = pFVar2 == this;
      if (pFVar2 == (FStat *)0x0) break;
    } while (pFVar2 != this);
    ppFVar1 = &(*ppFVar1)->m_Next;
  }
  if (bVar3) {
    *ppFVar1 = this->m_Next;
  }
  return;
}

Assistant:

FStat::~FStat ()
{
	FStat **prev = &FirstStat;

	while (*prev && *prev != this)
		prev = &((*prev)->m_Next)->m_Next;

	if (*prev == this)
		*prev = m_Next;
}